

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-dis.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string *psVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  Module local_a38;
  undefined1 local_648 [8];
  ToolOptions options;
  Output output;
  ostream local_2c8 [272];
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  size_type *local_b8;
  string sourceMapFilename;
  string WasmDisOption;
  key_type local_50;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  
  local_b8 = &sourceMapFilename._M_string_length;
  sourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  sourceMapFilename._M_string_length._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(sourceMapFilename.field_2._M_local_buf + 8),"wasm-dis options",
             (allocator<char> *)&local_a38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a38,"wasm-dis",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,
             "Un-assemble a .wasm (WebAssembly binary format) into a .wat (WebAssembly text format)"
             ,(allocator<char> *)(&WasmDisOption.field_2._M_allocated_capacity + 1));
  wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_648,(string *)&local_a38,(string *)&options.enabledFeatures);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  std::__cxx11::string::~string((string *)&local_a38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"--output",&local_2f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"-o",&local_2e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Output file (stdout if not specified)",&local_2d);
  WasmDisOption.field_2._8_8_ = 0;
  psVar1 = (string *)
           wasm::Options::add((string *)&options,(string *)&local_a38,
                              (string *)&options.enabledFeatures,(string *)&local_50,
                              (int)&sourceMapFilename + 0x18,(function *)0x1,
                              SUB81((allocator<char> *)
                                    (&WasmDisOption.field_2._M_allocated_capacity + 1),0));
  std::__cxx11::string::string<std::allocator<char>>(local_178,"--source-map",&local_2c);
  std::__cxx11::string::string<std::allocator<char>>(local_158,"-sm",&local_2b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"Consume source map from the specified file to add location information",
             &local_2a);
  local_1b8._8_8_ = 0;
  local_1b8._M_unused._M_object = &local_b8;
  local_1a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-dis.cpp:54:7)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-dis.cpp:54:7)>
              ::_M_manager;
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_178,local_158,local_138,(int)&sourceMapFilename + 0x18,
                              (function *)0x1,SUB81(&local_1b8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_118,"INFILE",&local_29);
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_180 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-dis.cpp:59:21)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-dis.cpp:59:21)>
              ::_M_manager;
  wasm::Options::add_positional(psVar1,(Arguments)local_118,(function *)0x1);
  std::_Function_base::~_Function_base((_Function_base *)&local_198);
  std::__cxx11::string::~string(local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  std::_Function_base::~_Function_base((_Function_base *)((long)&WasmDisOption.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  std::__cxx11::string::~string((string *)&local_a38);
  wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  if ((char)options._vptr_ToolOptions == '\x01') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"parsing binary...");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  wasm::Module::Module(&local_a38);
  local_50._M_dataplus._M_p._4_4_ = 0;
  local_a38.features.features = ~options.profile & (local_a38.features.features | options._368_4_);
  local_50._M_string_length._0_1_ = 0;
  local_50._M_dataplus._M_p._0_2_ = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"infile",
             (allocator<char> *)(WasmDisOption.field_2._M_local_buf + 8));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,(key_type *)&options.enabledFeatures);
  std::__cxx11::string::string(local_f8,(string *)pmVar3);
  std::__cxx11::string::string(local_d8,(string *)&local_b8);
  wasm::ModuleReader::readBinary(&local_50,local_f8,&local_a38,local_d8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  if (options.passOptions.passesToSkip._M_h._M_single_bucket._1_1_ == '\0') {
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&local_a38.typeIndices._M_h);
  }
  if ((char)options._vptr_ToolOptions != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Printing...");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"output",
             (allocator<char> *)(WasmDisOption.field_2._M_local_buf + 8));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,&local_50);
  wasm::Output::Output((Output *)&options.enabledFeatures,(string *)pmVar3,Text);
  std::__cxx11::string::~string((string *)&local_50);
  poVar2 = (ostream *)std::operator<<(local_2c8,&local_a38);
  std::operator<<(poVar2,'\n');
  if ((char)options._vptr_ToolOptions == '\x01') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Done.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  wasm::Output::~Output((Output *)&options.enabledFeatures);
  wasm::Module::~Module(&local_a38);
  wasm::ToolOptions::~ToolOptions((ToolOptions *)local_648);
  std::__cxx11::string::~string((string *)(sourceMapFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_b8);
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string sourceMapFilename;

  const std::string WasmDisOption = "wasm-dis options";

  ToolOptions options("wasm-dis",
                      "Un-assemble a .wasm (WebAssembly binary format) into a "
                      ".wat (WebAssembly text format)");
  options
    .add("--output",
         "-o",
         "Output file (stdout if not specified)",
         WasmDisOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add(
      "--source-map",
      "-sm",
      "Consume source map from the specified file to add location information",
      WasmDisOption,
      Options::Arguments::One,
      [&sourceMapFilename](Options* o, const std::string& argument) {
        sourceMapFilename = argument;
      })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  if (options.debug) {
    std::cerr << "parsing binary..." << std::endl;
  }
  Module wasm;
  options.applyOptionsBeforeParse(wasm);
  try {
    ModuleReader().readBinary(options.extra["infile"], wasm, sourceMapFilename);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    if (options.debug) {
      Fatal() << "error parsing wasm. here is what we read up to the error:\n"
              << wasm;
    } else {
      Fatal() << "error parsing wasm (try --debug for more info)";
    }
  } catch (MapParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error in parsing wasm source mapping";
  }

  options.applyOptionsAfterParse(wasm);

  // TODO: Validation. However, validating would mean that users are forced to
  //       run with  wasm-dis -all  or such, to enable the features (unless the
  //       features section is present, but that's rare in general). It would be
  //       better to have an "autodetect" code path that enables used features
  //       eventually.

  if (options.debug) {
    std::cerr << "Printing..." << std::endl;
  }
  Output output(options.extra["output"], Flags::Text);
  output.getStream() << wasm << '\n';

  if (options.debug) {
    std::cerr << "Done." << std::endl;
  }
}